

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nls.c
# Opt level: O0

int lmdif(custom_funcmult *funcmult,double *x,int M,int N,double *fvec,double *fjac,int ldfjac,
         int maxfev,double *diag,int mode,double factor,int nprint,double eps,double epsfcn,
         double ftol,double gtol,double xtol,int *nfev,int *njev,int *ipvt,double *qtf)

{
  double *rdiag;
  double *acnorm;
  double *x_00;
  double *x_01;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *wa4;
  double *wa3;
  double *wa2;
  double *wa1;
  double zero;
  double xnorm;
  double temp2;
  double temp1;
  double temp;
  double sum;
  double ratio;
  double p0001;
  double p75;
  double p25;
  double p5;
  double p1;
  double prered;
  double pnorm;
  double par;
  double one;
  double gnorm;
  double fnorm1;
  double fnorm;
  double epsmch;
  double dirder;
  double delta;
  double actred;
  int local_78;
  int iter;
  int l;
  int j;
  int i;
  int info;
  double xtol_local;
  double gtol_local;
  double ftol_local;
  double epsfcn_local;
  double eps_local;
  double factor_local;
  double *fjac_local;
  double *fvec_local;
  int N_local;
  int M_local;
  double *x_local;
  custom_funcmult *funcmult_local;
  
  _i = xtol;
  xtol_local = gtol;
  gtol_local = ftol;
  ftol_local = epsfcn;
  epsfcn_local = eps;
  eps_local = factor;
  factor_local = (double)fjac;
  fjac_local = fvec;
  fvec_local._0_4_ = N;
  fvec_local._4_4_ = M;
  _N_local = x;
  x_local = (double *)funcmult;
  rdiag = (double *)malloc((long)N << 3);
  acnorm = (double *)malloc((long)(int)fvec_local << 3);
  x_00 = (double *)malloc((long)(int)fvec_local << 3);
  x_01 = (double *)malloc((long)fvec_local._4_4_ << 3);
  par = 1.0;
  fnorm = epsfcn_local;
  j = 0;
  *nfev = 0;
  *njev = 0;
  if (((((int)fvec_local < 1) || (fvec_local._4_4_ < (int)fvec_local)) ||
      (ldfjac < fvec_local._4_4_)) ||
     (((gtol_local < 0.0 || (_i < 0.0)) ||
      ((xtol_local < 0.0 || ((maxfev < 1 || (eps_local <= 0.0)))))))) {
    funcmult_local._4_4_ = 0;
  }
  else {
    if (mode == 2) {
      for (iter = 0; iter < (int)fvec_local; iter = iter + 1) {
        if (diag[iter] <= 0.0) {
          return 0;
        }
      }
    }
    (*(code *)*x_local)(_N_local,fvec_local._4_4_,(int)fvec_local,fjac_local,x_local[1]);
    *nfev = 1;
    fnorm1 = enorm(fjac_local,fvec_local._4_4_);
    pnorm = 0.0;
    actred._4_4_ = 1;
    do {
      sum = 0.0;
      fdjac2((custom_funcmult *)x_local,_N_local,fvec_local._4_4_,(int)fvec_local,fjac_local,
             (double *)factor_local,ldfjac,ftol_local,fnorm);
      *njev = *njev + (int)fvec_local;
      qrfac((double *)factor_local,fvec_local._4_4_,(int)fvec_local,ldfjac,1,ipvt,(int)fvec_local,
            rdiag,acnorm,epsfcn_local);
      if (actred._4_4_ == 1) {
        if (mode != 2) {
          for (iter = 0; iter < (int)fvec_local; iter = iter + 1) {
            diag[iter] = acnorm[iter];
            if ((acnorm[iter] == 0.0) && (!NAN(acnorm[iter]))) {
              diag[iter] = par;
            }
          }
        }
        for (iter = 0; iter < (int)fvec_local; iter = iter + 1) {
          x_00[iter] = diag[iter] * _N_local[iter];
        }
        zero = enorm(x_00,(int)fvec_local);
        dirder = eps_local * zero;
        if ((dirder == 0.0) && (!NAN(dirder))) {
          dirder = eps_local;
        }
      }
      for (l = 0; l < fvec_local._4_4_; l = l + 1) {
        x_01[l] = fjac_local[l];
      }
      for (iter = 0; iter < (int)fvec_local; iter = iter + 1) {
        dVar1 = *(double *)((long)factor_local + (long)(iter * (int)fvec_local + iter) * 8);
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          temp = 0.0;
          for (l = iter; l < fvec_local._4_4_; l = l + 1) {
            temp = *(double *)((long)factor_local + (long)(l * (int)fvec_local + iter) * 8) *
                   x_01[l] + temp;
          }
          dVar1 = *(double *)((long)factor_local + (long)(iter * (int)fvec_local + iter) * 8);
          for (l = iter; l < fvec_local._4_4_; l = l + 1) {
            x_01[l] = *(double *)((long)factor_local + (long)(l * (int)fvec_local + iter) * 8) *
                      (-temp / dVar1) + x_01[l];
          }
        }
        *(double *)((long)factor_local + (long)(iter * (int)fvec_local + iter) * 8) = rdiag[iter];
        qtf[iter] = x_01[iter];
      }
      one = 0.0;
      if ((fnorm1 != 0.0) || (NAN(fnorm1))) {
        for (iter = 0; iter < (int)fvec_local; iter = iter + 1) {
          local_78 = ipvt[iter];
          if ((acnorm[local_78] != 0.0) || (NAN(acnorm[local_78]))) {
            temp = 0.0;
            for (l = 0; l <= iter; l = l + 1) {
              temp = *(double *)((long)factor_local + (long)(l * (int)fvec_local + iter) * 8) *
                     (qtf[l] / fnorm1) + temp;
            }
            one = pmax(one,ABS(temp / acnorm[local_78]));
          }
        }
      }
      if (one <= xtol_local) {
        j = 4;
      }
      if (j != 0) break;
      if (mode != 2) {
        for (iter = 0; iter < (int)fvec_local; iter = iter + 1) {
          dVar1 = pmax(diag[iter],acnorm[iter]);
          diag[iter] = dVar1;
        }
      }
      do {
        if (0.0001 <= sum) break;
        lmpar((double *)factor_local,ldfjac,(int)fvec_local,ipvt,diag,qtf,dirder,&pnorm,rdiag,acnorm
             );
        for (iter = 0; iter < (int)fvec_local; iter = iter + 1) {
          rdiag[iter] = -rdiag[iter];
          acnorm[iter] = _N_local[iter] + rdiag[iter];
          x_00[iter] = diag[iter] * rdiag[iter];
        }
        dVar1 = enorm(x_00,(int)fvec_local);
        if (actred._4_4_ == 1) {
          dirder = pmin(dirder,dVar1);
        }
        (*(code *)*x_local)(acnorm,fvec_local._4_4_,(int)fvec_local,x_01,x_local[1]);
        *nfev = *nfev + 1;
        gnorm = enorm(x_01,fvec_local._4_4_);
        delta = -par;
        if (gnorm * 0.1 < fnorm1) {
          delta = -(gnorm / fnorm1) * (gnorm / fnorm1) + par;
        }
        for (iter = 0; iter < (int)fvec_local; iter = iter + 1) {
          x_00[iter] = 0.0;
          local_78 = ipvt[iter];
          dVar2 = rdiag[local_78];
          for (l = 0; l <= iter; l = l + 1) {
            x_00[l] = *(double *)((long)factor_local + (long)(l * (int)fvec_local + iter) * 8) *
                      dVar2 + x_00[l];
          }
        }
        dVar2 = enorm(x_00,(int)fvec_local);
        dVar2 = dVar2 / fnorm1;
        dVar3 = sqrt(pnorm);
        dVar3 = (dVar3 * dVar1) / fnorm1;
        dVar4 = dVar2 * dVar2 + (dVar3 * dVar3) / 0.5;
        epsmch = -(dVar2 * dVar2 + dVar3 * dVar3);
        sum = 0.0;
        if ((dVar4 != 0.0) || (NAN(dVar4))) {
          sum = delta / dVar4;
        }
        if (0.25 < sum) {
          if (((pnorm == 0.0) && (!NAN(pnorm))) || (0.75 <= sum)) {
            dirder = dVar1 / 0.5;
            pnorm = pnorm * 0.5;
          }
        }
        else {
          if (0.0 <= delta) {
            temp1 = 0.5;
          }
          else {
            temp1 = (epsmch * 0.5) / (delta * 0.5 + epsmch);
          }
          if ((fnorm1 <= gnorm * 0.1) || (temp1 < 0.1)) {
            temp1 = 0.1;
          }
          dVar1 = pmin(dirder,dVar1 / 0.1);
          dirder = temp1 * dVar1;
          pnorm = pnorm / temp1;
        }
        if (0.0001 <= sum) {
          for (iter = 0; iter < (int)fvec_local; iter = iter + 1) {
            _N_local[iter] = acnorm[iter];
            acnorm[iter] = diag[iter] * _N_local[iter];
          }
          for (l = 0; l < fvec_local._4_4_; l = l + 1) {
            fjac_local[l] = x_01[l];
          }
          zero = enorm(acnorm,(int)fvec_local);
          fnorm1 = gnorm;
          actred._4_4_ = actred._4_4_ + 1;
        }
        if (((ABS(delta) <= gtol_local) && (dVar4 <= gtol_local)) && (sum * 0.5 <= par)) {
          j = 1;
        }
        if (dirder <= _i * zero) {
          j = 2;
        }
        if ((((ABS(delta) <= gtol_local) && (dVar4 <= gtol_local)) && (sum * 0.5 <= par)) &&
           (j == 2)) {
          j = 3;
        }
        if (j != 0) break;
        if (maxfev <= *nfev) {
          j = 5;
        }
        if (((ABS(delta) <= fnorm) && (dVar4 <= fnorm)) && (sum * 0.5 <= par)) {
          j = 6;
        }
        if (dirder <= fnorm * zero) {
          j = 7;
        }
        if (one <= fnorm) {
          j = 8;
        }
      } while (j == 0);
    } while (j == 0);
    free(rdiag);
    free(acnorm);
    free(x_00);
    free(x_01);
    funcmult_local._4_4_ = j;
  }
  return funcmult_local._4_4_;
}

Assistant:

int lmdif(custom_funcmult *funcmult, double *x, int M, int N, double *fvec, double *fjac, int ldfjac,
		int maxfev,double *diag,int mode,double factor,int nprint,double eps,double epsfcn,double ftol,double gtol,
		double xtol,int *nfev,int *njev,int *ipvt, double *qtf) {
	int info;
	int i,j,l,iter;
    double actred,delta,dirder,epsmch,fnorm,fnorm1,gnorm,one,par,pnorm,prered,p1,p5,p25,p75,p0001,ratio,
    sum,temp,temp1,temp2,xnorm,zero;
    double *wa1,*wa2,*wa3,*wa4;

    /*
     * 	*   This routine is a C translation of Fortran Code by
    *     argonne national laboratory. minpack project. march 1980.
     	  burton s. garbow, kenneth e. hillstrom, jorge j. more
     *  M is a positive integer input variable set to the number
c         of functions.
c
c       N is a positive integer input variable set to the number
c         of variables. N must not exceed M.
c
c       x is an array of length N. on input x must contain
c         an initial estimate of the solution vector. on output x
c         contains the final estimate of the solution vector.
c
c       fvec is an output array of length M which contains
c         the functions evaluated at the output x.
c
c       fjac is an output M by N array. the upper N by N submatrix
c         of fjac contains an upper triangular matrix r with
c         diagonal elements of nonincreasing magnitude such that
c
c                t     t           t
c               p *(jac *jac)*p = r *r,
c
c         where p is a permutation matrix and jac is the final
c         calculated jacobian. column j of p is column ipvt(j)
c         (see below) of the identity matrix. the lower trapezoidal
c         part of fjac contains information generated during
c         the computation of r.
c
c       ldfjac is a positive integer input variable not less than M
c         which specifies the leading dimension of the array fjac.
c
c       ftol is a nonnegative input variable. termination
c         occurs when both the actual and predicted relative
c         reductions in the sum of squares are at most ftol.
c         therefore, ftol measures the relative error desired
c         in the sum of squares.
c
c       xtol is a nonnegative input variable. termination
c         occurs when the relative error between two consecutive
c         iterates is at most xtol. therefore, xtol measures the
c         relative error desired in the approximate solution.
c
c       gtol is a nonnegative input variable. termination
c         occurs when the cosine of the angle between fvec and
c         any column of the jacobian is at most gtol in absolute
c         value. therefore, gtol measures the orthogonality
c         desired between the function vector and the columns
c         of the jacobian.
c
c       maxfev is a positive integer input variable. termination
c         occurs when the number of calls to fcn with iflag = 1
c         has reached maxfev.
c
c       epsfcn is an input variable used in determining a suitable
c         step length for the forward-difference approximation. this
c         approximation assumes that the relative errors in the
c         functions are of the order of epsfcn. if epsfcn is less
c         than the machine precision, it is assumed that the relative
c         errors in the functions are of the order of the machine
c         precision.
c
c       diag is an array of length N. if mode = 1 (see
c         below), diag is internally set. if mode = 2, diag
c         must contain positive entries that serve as
c         multiplicative scale factors for the variables.
c
c       mode is an integer input variable. if mode = 1, the
c         variables will be scaled internally. if mode = 2,
c         the scaling is specified by the input diag. other
c         values of mode are equivalent to mode = 1.
c
c       factor is a positive input variable used in determining the
c         initial step bound. this bound is set to the product of
c         factor and the euclidean norm of diag*x if nonzero, or else
c         to factor itself. in most cases factor should lie in the
c         interval (.1,100.).100. is a generally recommended value.
c
c       nprint is an integer input variable that enables controlled
c         printing of iterates if it is positive. in this case,
c         fcn is called with iflag = 0 at the beginning of the first
c         iteration and every nprint iterations thereafter and
c         immediately prior to return, with x, fvec, and fjac
c         available for printing. fvec and fjac should not be
c         altered. if nprint is not positive, no special calls
c         of fcn with iflag = 0 are made.
c
c       info is an integer output variable. if the user has
c         terminated execution, info is set to the (negative)
c         value of iflag. see description of fcn. otherwise,
c         info is set as follows.
c
c         info = 0  improper input parameters.
c
c         info = 1  both actual and predicted relative reductions
c                   in the sum of squares are at most ftol.
c
c         info = 2  relative error between two consecutive iterates
c                   is at most xtol.
c
c         info = 3  conditions for info = 1 and info = 2 both hold.
c
c         info = 4  the cosine of the angle between fvec and any
c                   column of the jacobian is at most gtol in
c                   absolute value.
c
c         info = 5  number of calls to fcn with iflag = 1 has
c                   reached maxfev.
c
c         info = 6  ftol is too small. no further reduction in
c                   the sum of squares is possible.
c
c         info = 7  xtol is too small. no further improvement in
c                   the approximate solution x is possible.
c
c         info = 8  gtol is too small. fvec is orthogonal to the
c                   columns of the jacobian to machine precision.
c
c       nfev is an integer output variable set to the number of
c         calls to fcn with iflag = 1.
c
c       njev is an integer output variable set to the number of
c         calls to fcn with iflag = 2.
c
c       ipvt is an integer output array of length N. ipvt
c         defines a permutation matrix p such that jac*p = q*r,
c         where jac is the final calculated jacobian, q is
c         orthogonal (not stored), and r is upper triangular
c         with diagonal elements of nonincreasing magnitude.
c         column j of p is column ipvt(j) of the identity matrix.
c
c       qtf is an output array of length N which contains
c         the first n elements of the vector (q transpose)*fvec.
     */

	wa1 = (double*) malloc(sizeof(double) *N);
	wa2 = (double*) malloc(sizeof(double) *N);
	wa3 = (double*) malloc(sizeof(double) *N);
	wa4 = (double*) malloc(sizeof(double) *M);

    one = 1.0;
    zero = 0.0;
    p1 = 1.0e-1; p5 = 5.0e-1; p25 = 2.5e-1; p75 = 7.5e-1; p0001 = 1.0e-4;
    epsmch = eps;

    info = 0;
    *nfev = 0;
    *njev = 0;

    if (N <= 0 || M < N || ldfjac < M || ftol < zero || xtol < zero || gtol < zero || maxfev <= 0 || factor <= zero) {
    	return info;
    }

    if (mode == 2) {
		for(j = 0; j < N;++j) {
			if (diag[j] <= 0.0) {
				return info;
			}
		}
    }

    //     evaluate the function at the starting point
    //     and calculate its norm.

    FUNCMULT_EVAL(funcmult,x,M,N,fvec);
    *nfev= 1;
    fnorm = enorm(fvec,M);

    //     initialize levenberg-marquardt parameter and iteration counter.
    par = zero;
    iter = 1;
    ratio = zero;

    //     beginning of the outer loop.

    while(1) {
    	//        calculate the jacobian matrix.
    	ratio = zero;
    	fdjac2(funcmult,x,M,N,fvec,fjac,ldfjac,epsfcn,epsmch);
    	*njev = *njev + N;

    	//        compute the qr factorization of the jacobian.

    	qrfac(fjac,M,N,ldfjac,1,ipvt,N,wa1,wa2,eps);

    	//        on the first iteration and if mode is 1, scale according
    	//        to the norms of the columns of the initial jacobian.

    	if (iter == 1) {//80
    		if (mode != 2) {//60
    			for(j = 0;j < N;++j) {
    				diag[j] = wa2[j];
    				if (wa2[j] == zero) {
    					diag[j] = one;
    				}
    			}
    		}//60

    		//        on the first iteration, calculate the norm of the scaled x
    		//        and initialize the step bound delta.

    		for(j = 0; j < N;++j) {
    			wa3[j] = diag[j]*x[j];
    		}
            xnorm = enorm(wa3,N);
            delta = factor*xnorm;

            if (delta == zero) {
            	delta = factor;
            }

    	}//80

        //        form (q transpose)*fvec and store the first n components in
        //        qtf.

    	for(i = 0; i < M;++i) {
    		wa4[i] = fvec[i];
    	}

    	for(j = 0; j < N;++j) {//130
    		if (fjac[j*N+j] != zero) {//120
    			sum = zero;
    			for(i = j; i < M;++i) {//100
    				sum = sum + fjac[i*N+j]*wa4[i];
    			}//100
    			temp = -sum/fjac[j*N+j];
    			for(i = j; i < M;++i) {//110
    				wa4[i] = wa4[i] + fjac[i*N+j]*temp;
    			}//110
    		}//120
            fjac[j*N+j] = wa1[j];
            qtf[j] = wa4[j];
    	}//130

    	//        compute the norm of the scaled gradient.
    	gnorm = zero;

    	if (fnorm != zero) {//170
    		for(j = 0; j < N;++j) {//160
    			l = ipvt[j];
    			if (wa2[l] != zero) {//150
    				sum = zero;
    				for(i = 0; i <= j;++i) { //140
    					sum = sum + fjac[i*N+j]*(qtf[i]/fnorm);
    				}//140
    				gnorm = pmax(gnorm,fabs(sum/wa2[l]));
    			}//150
    		}//160
    	}//170

    	//        test for convergence of the gradient norm.
    	if (gnorm <= gtol) {
    		info = 4;
    	}
    	if (info != 0) {
    		break;
    	}

    	//        rescale if necessary.
    	if (mode != 2) { //190
    		for(j = 0; j < N;++j) {
    			diag[j] = pmax(diag[j],wa2[j]);
    		}
    	}//190

    	//        beginning of the inner loop.

    	while(ratio < p0001) {
    		//           determine the levenberg-marquardt parameter.
    		lmpar(fjac,ldfjac,N,ipvt,diag,qtf,delta,&par,wa1,wa2);
    		//           store the direction p and x + p. calculate the norm of p.
    		for(j = 0; j < N;++j) {
                wa1[j] = -wa1[j];
                wa2[j] = x[j] + wa1[j];
                wa3[j] = diag[j]*wa1[j];
    		}
			
    		pnorm = enorm(wa3,N);
    		//           on the first iteration, adjust the initial step bound.
    		if (iter == 1) {
    			delta = pmin(delta,pnorm);
    		}
    		//           evaluate the function at x + p and calculate its norm.

    		FUNCMULT_EVAL(funcmult,wa2,M,N,wa4);
    		*nfev = *nfev + 1;
    		fnorm1 = enorm(wa4,M);

    		//           compute the scaled actual reduction.

            actred = -one;
            if (p1*fnorm1 < fnorm) {
            	actred = one - (fnorm1/fnorm)*(fnorm1/fnorm);
            }

            //           compute the scaled predicted reduction and
            //           the scaled directional derivative.

            for(j = 0; j < N;++j) {
                wa3[j] = zero;
                l = ipvt[j];
                temp = wa1[l];
                for(i = 0;i <= j;++i) {
                	wa3[i] = wa3[i] + fjac[i*N+j]*temp;
                }
            }

            temp1 = enorm(wa3,N);
            temp1 = temp1/fnorm;
            temp2 = (sqrt(par)*pnorm)/fnorm;
            prered = temp1*temp1 + temp2*temp2/p5;
            dirder = -(temp1*temp1 + temp2*temp2);
            //           compute the ratio of the actual to the predicted
            //           reduction.
            ratio = zero;
            if (prered != zero) {
            	ratio = actred/prered;
            }
            //           update the step bound.
			

            if (ratio <= p25) {//240
            	if (actred >= zero) {
            		temp = p5;
            	}
            	if (actred < zero) {
            		temp = p5*dirder/(dirder + p5*actred);
            	}
            	if (p1*fnorm1 >= fnorm || temp < p1) {
            		temp = p1;
            	}
                delta = temp*pmin(delta,pnorm/p1);
                par = par/temp;
            } else if (par == zero || ratio >= p75){//240 - 260
                delta = pnorm/p5;
                par = p5*par;
            }//260

            //           test for successful iteration.

            if (ratio >= p0001) {//290
            	//           successful iteration. update x, fvec, and their norms.
            	for(j = 0; j < N;++j) {
                    x[j] = wa2[j];
                    wa2[j] = diag[j]*x[j];
            	}
            	for(i = 0; i < M;++i) {
            		fvec[i] = wa4[i];
            	}
                xnorm = enorm(wa2,N);
                fnorm = fnorm1;
                iter = iter + 1;
            }//290
            //           tests for convergence.
            if ((fabs(actred) <= ftol) && (prered <= ftol) && (p5*ratio <= one)) {
            	info = 1;
            }
            if (delta <= xtol*xnorm) {
            	info = 2;
            }
            if ((fabs(actred) <= ftol) && (prered <= ftol) && (p5*ratio <= one) && (info == 2)) {
            	info = 3;
            }
            if (info != 0) {
            	break;
            }

            //           tests for termination and stringent tolerances.
            if (*nfev >= maxfev) {
            	info = 5;
            }
            if ((fabs(actred) <= epsmch) && (prered <= epsmch) && (p5*ratio <= one)) {
            	info = 6;
            }
            if (delta <= epsmch*xnorm) {
            	info = 7;
            }
            if (gnorm <= epsmch) {
            	info = 8;
            }
            if (info != 0) {
            	break;
            }

    	}

        if (info != 0) {
        	break;
        }


    }


    free(wa1);
    free(wa2);
    free(wa3);
    free(wa4);

	return info;
}